

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3ValueText(sqlite3_value *pVal,u8 enc)

{
  char in_SIL;
  long in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = (void *)0x0;
  }
  else if (((*(ushort *)(in_RDI + 0x14) & 0x202) == 0x202) && (*(char *)(in_RDI + 0x16) == in_SIL))
  {
    local_8 = *(void **)(in_RDI + 8);
  }
  else if ((*(ushort *)(in_RDI + 0x14) & 1) == 0) {
    local_8 = valueToText((sqlite3_value *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),'\0');
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE const void *sqlite3ValueText(sqlite3_value* pVal, u8 enc){
  if( !pVal ) return 0;
  assert( pVal->db==0 || sqlite3_mutex_held(pVal->db->mutex) );
  assert( (enc&3)==(enc&~SQLITE_UTF16_ALIGNED) );
  assert( !sqlite3VdbeMemIsRowSet(pVal) );
  if( (pVal->flags&(MEM_Str|MEM_Term))==(MEM_Str|MEM_Term) && pVal->enc==enc ){
    assert( sqlite3VdbeMemValidStrRep(pVal) );
    return pVal->z;
  }
  if( pVal->flags&MEM_Null ){
    return 0;
  }
  return valueToText(pVal, enc);
}